

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

Ref __thiscall
cashew::ValueBuilder::makeCall<cashew::Ref>(ValueBuilder *this,IString target,Ref args)

{
  Value *pVVar1;
  Ref RVar2;
  char *extraout_RDX;
  IString name;
  Ref local_58;
  Value *local_50;
  long local_48;
  size_t i;
  Ref argArray [1];
  Ref callArgs;
  size_t nArgs;
  Ref args_local;
  IString target_local;
  
  target_local.str._M_len = target.str._M_len;
  argArray[0] = makeRawArray(1);
  i = (size_t)target.str._M_str;
  for (local_48 = 0; local_48 == 0; local_48 = local_48 + 1) {
    pVVar1 = Ref::operator->(argArray);
    local_50 = argArray[local_48 + -1].inst;
    cashew::Value::push_back(pVVar1,(Ref)local_50);
  }
  local_58 = makeRawArray(3);
  pVVar1 = Ref::operator->(&local_58);
  RVar2 = makeRawString((IString *)CALL);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  name.str._M_str = extraout_RDX;
  name.str._M_len = target_local.str._M_len;
  RVar2 = makeName(this,name);
  pVVar1 = cashew::Value::push_back(pVVar1,RVar2);
  pVVar1 = cashew::Value::push_back(pVVar1,argArray[0].inst);
  Ref::Ref((Ref *)&target_local.str._M_str,pVVar1);
  return (Ref)(Value *)target_local.str._M_str;
}

Assistant:

static Ref makeCall(IString target, Ts... args) {
    size_t nArgs = sizeof...(Ts);
    Ref callArgs = makeRawArray(nArgs);
    Ref argArray[] = {args...};
    for (size_t i = 0; i < nArgs; ++i) {
      callArgs->push_back(argArray[i]);
    }
    return &makeRawArray(3)
              ->push_back(makeRawString(CALL))
              .push_back(makeName(target))
              .push_back(callArgs);
  }